

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

VP8StatusCode
ParseVP8Header(uint8_t **data_ptr,size_t *data_size,int have_all_data,size_t riff_size,
              size_t *chunk_size,int *is_lossless)

{
  int *data;
  ulong size;
  bool bVar1;
  VP8StatusCode VVar2;
  int iVar3;
  ulong uVar4;
  
  data = (int *)*data_ptr;
  iVar3 = *data;
  size = *data_size;
  VVar2 = VP8_STATUS_NOT_ENOUGH_DATA;
  if (7 < size) {
    if (*data == 0x20385056 || iVar3 == 0x4c385056) {
      VVar2 = data[1];
      uVar4 = (ulong)VVar2;
      if ((riff_size < 0xc) || (uVar4 <= riff_size - 0xc)) {
        if ((have_all_data == 0) || (uVar4 <= size - 8)) {
          *chunk_size = uVar4;
          *data_ptr = (uint8_t *)(data + 2);
          *data_size = *data_size - 8;
          *is_lossless = (uint)(iVar3 == 0x4c385056);
          bVar1 = true;
        }
        else {
          bVar1 = false;
          VVar2 = VP8_STATUS_NOT_ENOUGH_DATA;
        }
      }
      else {
        bVar1 = false;
        VVar2 = VP8_STATUS_BITSTREAM_ERROR;
      }
      if (!bVar1) {
        return VVar2;
      }
    }
    else {
      iVar3 = VP8LCheckSignature((uint8_t *)data,size);
      *is_lossless = iVar3;
      *chunk_size = *data_size;
    }
    VVar2 = VP8_STATUS_OK;
  }
  return VVar2;
}

Assistant:

static VP8StatusCode ParseVP8Header(const uint8_t** const data_ptr,
                                    size_t* const data_size, int have_all_data,
                                    size_t riff_size, size_t* const chunk_size,
                                    int* const is_lossless) {
  const uint8_t* const data = *data_ptr;
  const int is_vp8 = !memcmp(data, "VP8 ", TAG_SIZE);
  const int is_vp8l = !memcmp(data, "VP8L", TAG_SIZE);
  const uint32_t minimal_size =
      TAG_SIZE + CHUNK_HEADER_SIZE;  // "WEBP" + "VP8 nnnn" OR
                                     // "WEBP" + "VP8Lnnnn"
  assert(data != NULL);
  assert(data_size != NULL);
  assert(chunk_size != NULL);
  assert(is_lossless != NULL);

  if (*data_size < CHUNK_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;  // Insufficient data.
  }

  if (is_vp8 || is_vp8l) {
    // Bitstream contains VP8/VP8L header.
    const uint32_t size = GetLE32(data + TAG_SIZE);
    if ((riff_size >= minimal_size) && (size > riff_size - minimal_size)) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Inconsistent size information.
    }
    if (have_all_data && (size > *data_size - CHUNK_HEADER_SIZE)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;  // Truncated bitstream.
    }
    // Skip over CHUNK_HEADER_SIZE bytes from VP8/VP8L Header.
    *chunk_size = size;
    *data_ptr += CHUNK_HEADER_SIZE;
    *data_size -= CHUNK_HEADER_SIZE;
    *is_lossless = is_vp8l;
  } else {
    // Raw VP8/VP8L bitstream (no header).
    *is_lossless = VP8LCheckSignature(data, *data_size);
    *chunk_size = *data_size;
  }

  return VP8_STATUS_OK;
}